

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

intptr_t fio_accept(intptr_t srv_uuid)

{
  undefined1 *puVar1;
  undefined1 uVar2;
  byte bVar3;
  uint __fd;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int __fd_00;
  fio_data_s *pfVar7;
  long lVar8;
  int optval;
  socklen_t size;
  socklen_t addrlen;
  sockaddr_in6 addrinfo [2];
  
  addrlen = 0x38;
  __fd_00 = (int)((ulong)srv_uuid >> 8);
  __fd = accept4(__fd_00,(sockaddr *)addrinfo,&addrlen,0x80800);
  if ((int)__fd < 1) {
    uVar6 = 0xffffffffffffffff;
  }
  else {
    optval = 1;
    setsockopt(__fd,6,1,&optval,4);
    optval = 0;
    size = 4;
    iVar4 = getsockopt(__fd,1,7,&optval,&size);
    if ((iVar4 == 0) && (optval < 0x20001)) {
      optval = 0x20000;
      setsockopt(__fd,1,7,&optval,4);
      optval = 0x20000;
      setsockopt(__fd,1,8,&optval,4);
    }
    lVar8 = (ulong)__fd * 0xa8;
    fio_lock((fio_lock_i *)((long)fio_data + lVar8 + 0x6c));
    fio_clear_fd((ulong)__fd,'\x01');
    LOCK();
    puVar1 = (undefined1 *)((long)fio_data + lVar8 + 0x6c);
    uVar2 = *puVar1;
    *puVar1 = 0;
    pfVar7 = fio_data;
    UNLOCK();
    optval = CONCAT31(optval._1_3_,uVar2);
    if (addrinfo[0].sin6_family == 1) {
      lVar5 = (long)__fd_00 * 0xa8;
      bVar3 = *(byte *)((long)fio_data + lVar5 + 0x71);
      *(byte *)((long)fio_data + lVar8 + 0x71) = bVar3;
      if ((ulong)bVar3 != 0) {
        memcpy((void *)((long)pfVar7 + lVar8 + 0x72),(void *)((long)pfVar7 + lVar5 + 0x72),
               (ulong)bVar3 + 1);
      }
    }
    else {
      fio_tcp_addr_cpy(__fd,(uint)addrinfo[0].sin6_family,(sockaddr *)addrinfo);
      pfVar7 = fio_data;
    }
    uVar6 = (ulong)CONCAT41(__fd,*(undefined1 *)((long)pfVar7 + lVar8 + 0x6d));
  }
  return uVar6;
}

Assistant:

intptr_t fio_accept(intptr_t srv_uuid) {
  struct sockaddr_in6 addrinfo[2]; /* grab a slice of stack (aligned) */
  socklen_t addrlen = sizeof(addrinfo);
  int client;
#ifdef SOCK_NONBLOCK
  client = accept4(fio_uuid2fd(srv_uuid), (struct sockaddr *)addrinfo, &addrlen,
                   SOCK_NONBLOCK | SOCK_CLOEXEC);
  if (client <= 0)
    return -1;
#else
  client = accept(fio_uuid2fd(srv_uuid), (struct sockaddr *)addrinfo, &addrlen);
  if (client <= 0)
    return -1;
  if (fio_set_non_block(client) == -1) {
    close(client);
    return -1;
  }
#endif
  // avoid the TCP delay algorithm.
  {
    int optval = 1;
    setsockopt(client, IPPROTO_TCP, TCP_NODELAY, &optval, sizeof(optval));
  }
  // handle socket buffers.
  {
    int optval = 0;
    socklen_t size = (socklen_t)sizeof(optval);
    if (!getsockopt(client, SOL_SOCKET, SO_SNDBUF, &optval, &size) &&
        optval <= 131072) {
      optval = 131072;
      setsockopt(client, SOL_SOCKET, SO_SNDBUF, &optval, sizeof(optval));
      optval = 131072;
      setsockopt(client, SOL_SOCKET, SO_RCVBUF, &optval, sizeof(optval));
    }
  }

  fio_lock(&fd_data(client).protocol_lock);
  fio_clear_fd(client, 1);
  fio_unlock(&fd_data(client).protocol_lock);
  /* copy peer address */
  if (((struct sockaddr *)addrinfo)->sa_family == AF_UNIX) {
    fd_data(client).addr_len = uuid_data(srv_uuid).addr_len;
    if (uuid_data(srv_uuid).addr_len) {
      memcpy(fd_data(client).addr, uuid_data(srv_uuid).addr,
             uuid_data(srv_uuid).addr_len + 1);
    }
  } else {
    fio_tcp_addr_cpy(client, ((struct sockaddr *)addrinfo)->sa_family,
                     (struct sockaddr *)addrinfo);
  }

  return fd2uuid(client);
}